

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<4,_9,_9>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  undefined8 *puVar2;
  float *pfVar3;
  long lVar4;
  undefined4 *puVar5;
  Vector<float,_3> *b;
  long lVar6;
  Vector<float,_3> *pVVar7;
  float *pfVar8;
  long lVar9;
  undefined8 *puVar10;
  int col;
  undefined4 uVar11;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Type in1;
  Type in0;
  Vec4 *local_b0;
  undefined8 local_a8;
  float local_a0 [6];
  Matrix<float,_3,_3> local_88;
  undefined8 local_58;
  float fStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  float fStack_44;
  undefined8 uStack_40;
  float local_38;
  Matrix<float,_3,_3> local_2c;
  
  puVar2 = &local_58;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar9 = 0;
      do {
        uVar11 = 0x3f800000;
        if (lVar4 != lVar9) {
          uVar11 = 0;
        }
        *(undefined4 *)((long)puVar2 + lVar9) = uVar11;
        lVar9 = lVar9 + 0xc;
      } while (lVar9 != 0x24);
      lVar6 = lVar6 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      lVar4 = lVar4 + 0xc;
    } while (lVar6 != 3);
    local_58 = *(undefined8 *)evalCtx->in[0].m_data;
    fStack_50 = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    fStack_44 = evalCtx->in[1].m_data[2];
    uStack_4c = (undefined4)uVar1;
    uStack_48 = (undefined4)((ulong)uVar1 >> 0x20);
    uStack_40 = *(undefined8 *)evalCtx->in[2].m_data;
    local_38 = evalCtx->in[2].m_data[2];
  }
  else {
    uStack_48 = 0;
    fStack_44 = 0.0;
    uStack_40 = 0;
    local_58 = 0;
    fStack_50 = 0.0;
    uStack_4c = 0;
    local_38 = 0.0;
    puVar5 = &s_constInMat3x3;
    lVar4 = 0;
    do {
      lVar6 = 0;
      puVar10 = puVar2;
      do {
        *(undefined4 *)puVar10 = puVar5[lVar6];
        lVar6 = lVar6 + 1;
        puVar10 = (undefined8 *)((long)puVar10 + 0xc);
      } while (lVar6 != 3);
      lVar4 = lVar4 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      puVar5 = puVar5 + 3;
    } while (lVar4 != 3);
  }
  pfVar3 = (float *)&local_88;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    b = (Vector<float,_3> *)0x0;
    lVar4 = 0;
    do {
      pVVar7 = (Vector<float,_3> *)0x0;
      do {
        uVar11 = 0x3f800000;
        if (b != pVVar7) {
          uVar11 = 0;
        }
        *(undefined4 *)((long)pfVar3 + (long)pVVar7) = uVar11;
        pVVar7 = pVVar7 + 1;
      } while (pVVar7 != (Vector<float,_3> *)0x24);
      lVar4 = lVar4 + 1;
      pfVar3 = pfVar3 + 1;
      b = (((Matrix<float,_3,_3> *)b)->m_data).m_data + 1;
    } while (lVar4 != 3);
    local_88.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_88.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    local_88.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
    local_88.m_data.m_data[1].m_data[0] = (float)uVar1;
    local_88.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
    local_88.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_88.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  }
  else {
    local_88.m_data.m_data[1].m_data[1] = 0.0;
    local_88.m_data.m_data[1].m_data[2] = 0.0;
    local_88.m_data.m_data[2].m_data[0] = 0.0;
    local_88.m_data.m_data[2].m_data[1] = 0.0;
    local_88.m_data.m_data[0].m_data[0] = 0.0;
    local_88.m_data.m_data[0].m_data[1] = 0.0;
    local_88.m_data.m_data[0].m_data[2] = 0.0;
    local_88.m_data.m_data[1].m_data[0] = 0.0;
    local_88.m_data.m_data[2].m_data[2] = 0.0;
    b = (Vector<float,_3> *)&DAT_01c37874;
    lVar4 = 0;
    do {
      lVar6 = 0;
      pfVar8 = pfVar3;
      do {
        *pfVar8 = b->m_data[lVar6];
        lVar6 = lVar6 + 1;
        pfVar8 = pfVar8 + 3;
      } while (lVar6 != 3);
      lVar4 = lVar4 + 1;
      pfVar3 = pfVar3 + 1;
      b = b + 1;
    } while (lVar4 != 3);
  }
  matrixCompMult<float,3,3>
            (&local_2c,(MatrixCaseUtils *)&local_58,&local_88,(Matrix<float,_3,_3> *)b);
  local_a8 = (ulong)local_a8._4_4_ << 0x20;
  local_b0 = (Vec4 *)0x0;
  lVar4 = 0;
  do {
    *(float *)((long)&local_b0 + lVar4 * 4) =
         local_2c.m_data.m_data[0].m_data[lVar4] + local_2c.m_data.m_data[1].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_a0[4] = 0.0;
  local_a0[2] = 0.0;
  local_a0[3] = 0.0;
  lVar4 = 0;
  do {
    local_a0[lVar4 + 2] =
         *(float *)((long)&local_b0 + lVar4 * 4) + local_2c.m_data.m_data[2].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_b0 = &evalCtx->color;
  local_a8 = 0x100000000;
  local_a0[0] = 2.8026e-45;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_b0 + lVar4 * 4)] = local_a0[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}